

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocket::disconnectFromHost(QSslSocket *this)

{
  bool bVar1;
  QSslSocketPrivate *pQVar2;
  pointer pTVar3;
  QSslSocketPrivate *in_RDI;
  TlsCryptograph *backend;
  QSslSocketPrivate *d;
  SocketState in_stack_ffffffffffffffdc;
  
  pQVar2 = d_func((QSslSocket *)0x3a48bc);
  if ((pQVar2->plainSocket != (QTcpSocket *)0x0) &&
     ((pQVar2->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.state != UnconnectedState)) {
    if ((pQVar2->mode == UnencryptedMode) && ((pQVar2->autoStartHandshake & 1U) == 0)) {
      (**(code **)(*(long *)&pQVar2->plainSocket->super_QAbstractSocket + 0x100))();
    }
    else if ((int)(pQVar2->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.state < 3) {
      (pQVar2->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.pendingClose = true;
    }
    else {
      pTVar3 = std::
               unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
               ::get((unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
                      *)0x3a494e);
      if (pTVar3 != (pointer)0x0) {
        (**(code **)(*(long *)pTVar3 + 0xb0))();
      }
      if ((pQVar2->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.state != ClosingState) {
        (pQVar2->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.state = ClosingState;
        QAbstractSocket::stateChanged((QAbstractSocket *)0x3a499b,in_stack_ffffffffffffffdc);
      }
      bVar1 = QIODevicePrivate::QRingBufferRef::isEmpty((QRingBufferRef *)in_RDI);
      if (bVar1) {
        if (pQVar2->mode == UnencryptedMode) {
          (**(code **)(*(long *)&pQVar2->plainSocket->super_QAbstractSocket + 0x100))();
        }
        else {
          QSslSocketPrivate::disconnectFromHost(in_RDI);
        }
      }
      else {
        (pQVar2->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.pendingClose = true;
      }
    }
  }
  return;
}

Assistant:

void QSslSocket::disconnectFromHost()
{
    Q_D(QSslSocket);
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::disconnectFromHost()";
#endif
    if (!d->plainSocket)
        return;
    if (d->state == UnconnectedState)
        return;
    if (d->mode == UnencryptedMode && !d->autoStartHandshake) {
        d->plainSocket->disconnectFromHost();
        return;
    }
    if (d->state <= ConnectingState) {
        d->pendingClose = true;
        return;
    }
    // Make sure we don't process any signal from the CA fetcher
    // (Windows):
    if (auto *backend = d->backend.get())
        backend->cancelCAFetch();

    // Perhaps emit closing()
    if (d->state != ClosingState) {
        d->state = ClosingState;
        emit stateChanged(d->state);
    }

    if (!d->writeBuffer.isEmpty()) {
        d->pendingClose = true;
        return;
    }

    if (d->mode == UnencryptedMode) {
        d->plainSocket->disconnectFromHost();
    } else {
        d->disconnectFromHost();
    }
}